

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::EntryRepeat(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptString *pJVar8;
  char *message;
  char *error;
  uint lineNumber;
  charcount_t count;
  int in_stack_00000010;
  JavascriptString *local_58;
  JavascriptString *pThis;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa03,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d18de9;
    *puVar6 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa04,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d18de9;
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa07,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d18de9;
    *puVar6 = 0;
  }
  local_58 = (JavascriptString *)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar1,L"String.prototype.repeat",&local_58);
  if (((ulong)callInfo_local & 0xfffffe) == 0) goto LAB_00d18d84;
  pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d18c78;
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptOperators::IsUndefinedObject(pvVar7);
    if (BVar4 != 0) goto LAB_00d18d84;
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    pThis = (JavascriptString *)JavascriptConversion::ToInteger_Full(pvVar7,pSVar1);
    bVar3 = NumberUtilities::IsSpecial((double)pThis,0x7ff0000000000000);
    if ((bVar3) || ((double)pThis < 0.0)) goto LAB_00d18deb;
    uVar5 = NumberUtilities::LuFromDblNearest((double)pThis);
    pvVar7 = (Var)(ulong)uVar5;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d18de9;
    *puVar6 = 0;
LAB_00d18c78:
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        error = "(Is(aValue))";
        message = "Ensure var is actually a \'TaggedInt\'";
        lineNumber = 0x43;
        goto LAB_00d18d28;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      lineNumber = 0x2a;
LAB_00d18d28:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,lineNumber,error,message);
      if (!bVar3) {
LAB_00d18de9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    if ((int)pvVar7 < 0) {
LAB_00d18deb:
      JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ebf6,L"String.prototype.repeat");
    }
  }
  count = (charcount_t)pvVar7;
  if ((count != 0) && (local_58->m_charLength != 0)) {
    if (count == 1) {
      return local_58;
    }
    pJVar8 = RepeatCore(local_58,count,pSVar1);
    return pJVar8;
  }
LAB_00d18d84:
  pJVar8 = JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary);
  return pJVar8;
}

Assistant:

Var JavascriptString::EntryRepeat(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(String_Prototype_repeat);

        JavascriptString* pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.repeat"), &pThis);

        charcount_t count = 0;

        if (args.Info.Count > 1)
        {
            if (TaggedInt::Is(args[1]))
            {
                int32 signedCount = TaggedInt::ToInt32(args[1]);
                if (signedCount < 0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }
                count = (uint32) signedCount;
            }
            else if (!JavascriptOperators::IsUndefinedObject(args[1]))
            {
                double countDbl = JavascriptConversion::ToInteger_Full(args[1], scriptContext);
                if (JavascriptNumber::IsPosInf(countDbl) || countDbl < 0.0)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("String.prototype.repeat"));
                }

                count = NumberUtilities::LuFromDblNearest(countDbl);
            }
        }

        if (count == 0 || pThis->GetLength() == 0)
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }
        else if (count == 1)
        {
            return pThis;
        }

        return RepeatCore(pThis, count, scriptContext);
    }